

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

int __thiscall Catch::Session::runInternal(Session *this)

{
  ReporterPreferences *__position;
  Config *pCVar1;
  undefined8 *puVar2;
  long *plVar3;
  TestCaseHandle **ppTVar4;
  long lVar5;
  IStreamingReporter *pIVar6;
  size_t sVar7;
  pointer pFVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  undefined4 extraout_var_00;
  long *plVar14;
  ListeningReporter *this_00;
  undefined4 extraout_var_01;
  long *plVar15;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Rb_tree_node_base *p_Var16;
  char *pcVar17;
  TestCaseInfo **testInfo;
  pointer pFVar18;
  IStreamingReporter *pIVar19;
  TestCaseHandle **__v;
  size_t sVar20;
  const_iterator __begin3;
  long lVar21;
  int iVar22;
  size_t sVar23;
  IStreamingReporterPtr reporter;
  Totals totals;
  TestGroup tests;
  pointer local_318;
  IStreamingReporterPtr local_310;
  undefined1 local_308 [32];
  size_t local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  pointer local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  Totals local_2b8;
  Session *local_280;
  long local_278;
  IStreamingReporterPtr local_270;
  Config *local_268;
  RunContext local_260;
  IStreamingReporter local_78;
  undefined8 local_68;
  _Rb_tree_node_base *local_60;
  ReporterPreferences *local_58;
  undefined8 local_50;
  vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> vStack_48;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  config(this);
  pCVar1 = (this->m_config).m_ptr;
  if (pCVar1 != (Config *)0x0) {
    seedRng(&pCVar1->super_IConfig);
    if ((this->m_configData).filenamesAsTags == true) {
      pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar10 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
      puVar13 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0x10))
                          ((long *)CONCAT44(extraout_var,iVar10));
      puVar2 = (undefined8 *)puVar13[1];
      for (puVar13 = (undefined8 *)*puVar13; puVar13 != puVar2; puVar13 = puVar13 + 1) {
        TestCaseInfo::addFilenameTag((TestCaseInfo *)*puVar13);
      }
    }
    if (IMutableContext::currentContext == (long *)0x0) {
      IMutableContext::currentContext = (long *)operator_new(0x20);
      *IMutableContext::currentContext = 0;
      IMutableContext::currentContext[1] = 0;
      IMutableContext::currentContext[2] = 0;
      IMutableContext::currentContext[3] = 0;
      *IMutableContext::currentContext = (long)&PTR__Context_001bbb90;
      IMutableContext::currentContext[1] = 0;
      IMutableContext::currentContext[2] = 0;
      IMutableContext::currentContext[3] = 0;
    }
    (**(code **)(*IMutableContext::currentContext + 0x38))
              (IMutableContext::currentContext,(this->m_config).m_ptr);
    pCVar1 = (this->m_config).m_ptr;
    pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
    plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar10) + 0x20))
                                ((long *)CONCAT44(extraout_var_00,iVar10));
    local_280 = this;
    if (*plVar14 == plVar14[1]) {
      anon_unknown_23::createReporter
                ((anon_unknown_23 *)&local_310,&(pCVar1->m_data).reporterName,&pCVar1->super_IConfig
                );
    }
    else {
      this_00 = (ListeningReporter *)operator_new(0x30);
      (this_00->super_IStreamingReporter).m_preferences.shouldRedirectStdOut = false;
      (this_00->super_IStreamingReporter).m_preferences.shouldReportAllAssertions = true;
      (this_00->super_IStreamingReporter)._vptr_IStreamingReporter =
           (_func_int **)&PTR__ListeningReporter_001ba998;
      (this_00->m_listeners).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->m_listeners).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->m_listeners).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->m_reporter).m_ptr = (IStreamingReporter *)0x0;
      local_310.m_ptr = (IStreamingReporter *)this_00;
      pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar10 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
      plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x20))
                                  ((long *)CONCAT44(extraout_var_01,iVar10));
      plVar14 = (long *)*plVar15;
      plVar15 = (long *)plVar15[1];
      if (plVar14 != plVar15) {
        do {
          plVar3 = (long *)*plVar14;
          if (plVar3 == (long *)0x0) {
            pcVar17 = 
            "T *Catch::Detail::unique_ptr<Catch::IReporterFactory>::operator->() const [T = Catch::IReporterFactory]"
            ;
            goto LAB_00145df0;
          }
          iVar10 = (*(pCVar1->super_IConfig)._vptr_IConfig[3])(pCVar1);
          local_270.m_ptr = (IStreamingReporter *)CONCAT44(extraout_var_02,iVar10);
          local_268 = pCVar1;
          (**(code **)(*plVar3 + 0x10))
                    ((unique_ptr<Catch::IStreamingReporter> *)local_308,plVar3,&local_270);
          std::
          vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>>
          ::emplace_back<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>
                    ((vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>>
                      *)&this_00->m_listeners,(unique_ptr<Catch::IStreamingReporter> *)local_308);
          if ((IStreamingReporter *)local_308._0_8_ != (IStreamingReporter *)0x0) {
            (**(code **)(*(long *)local_308._0_8_ + 8))();
          }
          plVar14 = plVar14 + 1;
        } while (plVar14 != plVar15);
      }
      anon_unknown_23::createReporter
                ((anon_unknown_23 *)&local_270,&(pCVar1->m_data).reporterName,&pCVar1->super_IConfig
                );
      ListeningReporter::addReporter(this_00,&local_270);
      this = local_280;
      if ((ListeningReporter *)local_270.m_ptr != (ListeningReporter *)0x0) {
        (*((IStreamingReporter *)&(local_270.m_ptr)->_vptr_IStreamingReporter)->
          _vptr_IStreamingReporter[1])();
      }
    }
    if ((ListeningReporter *)local_310.m_ptr == (ListeningReporter *)0x0) {
      pcVar17 = 
      "T &Catch::Detail::unique_ptr<Catch::IStreamingReporter>::operator*() [T = Catch::IStreamingReporter]"
      ;
      goto LAB_00145e26;
    }
    pCVar1 = (this->m_config).m_ptr;
    if (pCVar1 != (Config *)0x0) {
      bVar9 = list(local_310.m_ptr,pCVar1);
      iVar10 = 0;
      if (bVar9) goto LAB_00145d5d;
      local_268 = (this->m_config).m_ptr;
      local_270.m_ptr = local_310.m_ptr;
      RunContext::RunContext(&local_260,&local_268->super_IConfig,&local_310);
      pCVar1 = local_268;
      __position = &local_78.m_preferences;
      local_78.m_preferences.shouldRedirectStdOut = false;
      local_78.m_preferences.shouldReportAllAssertions = false;
      local_78._10_2_ = 0;
      local_68 = 0;
      local_50 = 0;
      vStack_48.
      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_48.
      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_48.
      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_60 = (_Rb_tree_node_base *)__position;
      local_58 = __position;
      pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar10 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
      testCases = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar10) + 0x20))
                            ((long *)CONCAT44(extraout_var_03,iVar10),pCVar1);
      iVar10 = (*(local_268->super_IConfig)._vptr_IConfig[0xd])();
      TestSpec::matchesByFilter
                ((Matches *)&local_2b8,(TestSpec *)CONCAT44(extraout_var_04,iVar10),testCases,
                 &local_268->super_IConfig);
      local_308._16_8_ =
           vStack_48.
           super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_308._8_8_ =
           vStack_48.
           super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_308._0_8_ =
           vStack_48.
           super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
           ._M_impl.super__Vector_impl_data._M_start;
      vStack_48.
      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8._0_8_;
      vStack_48.
      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2b8.assertions.passed;
      vStack_48.
      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2b8.assertions.failed;
      local_2b8._0_8_ = (pointer)0x0;
      local_2b8.assertions.passed = 0;
      local_2b8.assertions.failed = 0;
      std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
      ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *
              )local_308);
      std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
      ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *
              )&local_2b8);
      iVar10 = (*(local_268->super_IConfig)._vptr_IConfig[0xd])();
      pFVar8 = vStack_48.
               super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (vStack_48.
          super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          vStack_48.
          super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (*(long *)(CONCAT44(extraout_var_05,iVar10) + 0x18) ==
            *(long *)(CONCAT44(extraout_var_05,iVar10) + 0x20)) {
          pIVar19 = (IStreamingReporter *)
                    (testCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pIVar6 = (IStreamingReporter *)
                   (testCases->
                   super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pIVar19 != pIVar6) {
            do {
              if ((((TestCaseInfo *)pIVar19->_vptr_IStreamingReporter)->properties & IsHidden) ==
                  None) {
                local_308._0_8_ = pIVar19;
                std::
                _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                ::_M_emplace_unique<Catch::TestCaseHandle_const*>
                          ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                            *)&local_78,(TestCaseHandle **)local_308);
              }
              pIVar19 = pIVar19 + 1;
            } while (pIVar19 != pIVar6);
          }
        }
        else if (vStack_48.
                 super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 vStack_48.
                 super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00145a4f;
      }
      else {
LAB_00145a4f:
        pFVar18 = vStack_48.
                  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          ppTVar4 = (pFVar18->tests).
                    super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_308._0_8_ = &local_78;
          for (__v = (pFVar18->tests).
                     super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; __v != ppTVar4; __v = __v + 1) {
            std::
            _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
            ::
            _M_insert_unique_<Catch::TestCaseHandle_const*const&,std::_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>::_Alloc_node>
                      ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                        *)&local_78,(const_iterator)__position,__v,(_Alloc_node *)local_308);
          }
          pFVar18 = pFVar18 + 1;
        } while (pFVar18 != pFVar8);
      }
      iVar10 = (*(local_268->super_IConfig)._vptr_IConfig[0xd])();
      local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
      local_2b8.assertions.passed = 0;
      local_2b8.assertions.failed = 0;
      local_2b8.assertions.failedButOk = 0;
      local_2b8.testCases.passed = 0;
      local_2b8.testCases.failed = 0;
      local_2b8.testCases.failedButOk = 0;
      (*(local_268->super_IConfig)._vptr_IConfig[4])(local_308);
      RunContext::testGroupStarting(&local_260,(string *)local_308,1,1);
      if ((IStreamingReporter *)local_308._0_8_ != (IStreamingReporter *)(local_308 + 0x10)) {
        operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
      }
      lVar21 = CONCAT44(extraout_var_06,iVar10);
      if (local_60 != (_Rb_tree_node_base *)__position) {
        local_318 = (pointer)local_2b8.assertions.passed;
        local_2d0 = (pointer)local_2b8.assertions.failed;
        local_2c8 = local_2b8.assertions.failedButOk;
        local_2c0 = local_2b8.testCases.failed;
        sVar20 = local_2b8.testCases.failedButOk;
        p_Var16 = local_60;
        sVar23 = local_2b8.testCases.passed;
        local_278 = CONCAT44(extraout_var_06,iVar10);
        do {
          sVar7 = local_260.m_totals.assertions.failed;
          iVar10 = (*(local_260.m_config)->_vptr_IConfig[9])();
          if (sVar7 < (ulong)(long)iVar10) {
            RunContext::runTest((Totals *)local_308,&local_260,*(TestCaseHandle **)(p_Var16 + 1));
            local_318 = (pointer)((long)&(local_318->name)._M_dataplus._M_p + local_308._8_8_);
            local_2d0 = (pointer)((long)&(local_2d0->name)._M_dataplus._M_p + local_308._16_8_);
            local_2c8 = local_2c8 + local_308._24_8_;
            sVar23 = sVar23 + local_2e8;
            local_2c0 = local_2c0 + local_2e0;
            sVar20 = sVar20 + local_2d8;
          }
          else {
            (*((IStreamingReporter *)&(local_270.m_ptr)->_vptr_IStreamingReporter)->
              _vptr_IStreamingReporter[0x12])(local_270.m_ptr,**(undefined8 **)(p_Var16 + 1));
          }
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        } while (p_Var16 != (_Rb_tree_node_base *)__position);
        local_2b8.assertions.failed = (size_t)local_2d0;
        local_2b8.assertions.failedButOk = local_2c8;
        local_2b8.testCases.failed = local_2c0;
        local_2b8.assertions.passed = (size_t)local_318;
        lVar21 = local_278;
        local_2b8.testCases.passed = sVar23;
        local_2b8.testCases.failedButOk = sVar20;
      }
      pFVar8 = vStack_48.
               super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar22 = 0;
      for (pFVar18 = vStack_48.
                     super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                     ._M_impl.super__Vector_impl_data._M_start; pFVar18 != pFVar8;
          pFVar18 = pFVar18 + 1) {
        if ((pFVar18->tests).
            super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (pFVar18->tests).
            super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar22 = -1;
          (*((IStreamingReporter *)&(local_270.m_ptr)->_vptr_IStreamingReporter)->
            _vptr_IStreamingReporter[2])(local_270.m_ptr,pFVar18);
        }
      }
      local_2b8.error = iVar22;
      lVar5 = *(long *)(lVar21 + 0x20);
      for (lVar21 = *(long *)(lVar21 + 0x18); lVar21 != lVar5; lVar21 = lVar21 + 0x20) {
        (*((IStreamingReporter *)&(local_270.m_ptr)->_vptr_IStreamingReporter)->
          _vptr_IStreamingReporter[3])(local_270.m_ptr,lVar21);
      }
      (*(local_268->super_IConfig)._vptr_IConfig[4])(local_308);
      RunContext::testGroupEnded(&local_260,(string *)local_308,&local_2b8,1,1);
      if ((IStreamingReporter *)local_308._0_8_ != (IStreamingReporter *)(local_308 + 0x10)) {
        operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
      }
      pCVar1 = (local_280->m_config).m_ptr;
      if (pCVar1 == (Config *)0x0) {
        pcVar17 = 
        "T *Catch::Detail::unique_ptr<Catch::Config>::operator->() const [T = Catch::Config]";
LAB_00145df0:
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                      ,0x4b8,pcVar17);
      }
      iVar11 = (*(pCVar1->super_IConfig)._vptr_IConfig[8])();
      iVar10 = 2;
      if (((byte)iVar11 & iVar22 == -1) == 0) {
        iVar11 = (int)local_2b8.assertions.failed;
        if ((int)local_2b8.assertions.failed <= iVar22) {
          iVar11 = local_2b8.error;
        }
        iVar10 = 0xff;
        if (iVar11 < 0xff) {
          iVar10 = iVar11;
        }
      }
      std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
      ~vector(&vStack_48);
      std::
      _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
      ::~_Rb_tree((_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                   *)&local_78);
      RunContext::~RunContext(&local_260);
LAB_00145d5d:
      if ((ListeningReporter *)local_310.m_ptr != (ListeningReporter *)0x0) {
        (*((IStreamingReporter *)&(local_310.m_ptr)->_vptr_IStreamingReporter)->
          _vptr_IStreamingReporter[1])();
      }
      return iVar10;
    }
  }
  pcVar17 = "T &Catch::Detail::unique_ptr<Catch::Config>::operator*() [T = Catch::Config]";
LAB_00145e26:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                ,0x4b0,pcVar17);
}

Assistant:

int Session::runInternal() {
        if (m_startupExceptions)
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY{
            config(); // Force config to be constructed

            seedRng(*m_config);

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = makeReporter(m_config.get());

            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { std::move(reporter), m_config.get() };
            auto const totals = tests.execute();

            if (m_config->warnAboutNoTests() && totals.error == -1)
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min)(MaxExitCode, (std::max)(totals.error, static_cast<int>(totals.assertions.failed)));
        }